

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScriptModule
          (BinaryWriterSpec *this,string_view filename,ScriptModule *script_module)

{
  ScriptModuleType SVar1;
  TextScriptModule *pTVar2;
  Stream *this_00;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  SVar1 = script_module->type_;
  if (SVar1 == Quoted) {
    this_00 = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
              operator()(&this->module_stream_factory_,filename);
    pDVar3 = (DataScriptModule<(wabt::ScriptModuleType)1> *)
             cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>
                       (script_module);
    this_01 = &local_50;
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 != Text) {
        return;
      }
      pTVar2 = cast<wabt::TextScriptModule,wabt::ScriptModule>(script_module);
      WriteModule(this,filename,&pTVar2->module);
      return;
    }
    this_00 = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
              operator()(&this->module_stream_factory_,filename);
    pDVar3 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                       (script_module);
    this_01 = &local_38;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,&pDVar3->data);
  Stream::WriteData<unsigned_char>
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,"",No);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_01);
  return;
}

Assistant:

void BinaryWriterSpec::WriteScriptModule(std::string_view filename,
                                         const ScriptModule& script_module) {
  switch (script_module.type()) {
    case ScriptModuleType::Text:
      WriteModule(filename, cast<TextScriptModule>(&script_module)->module);
      break;

    case ScriptModuleType::Binary:
      module_stream_factory_(filename)->WriteData(
          cast<BinaryScriptModule>(&script_module)->data, "");
      break;

    case ScriptModuleType::Quoted:
      module_stream_factory_(filename)->WriteData(
          cast<QuotedScriptModule>(&script_module)->data, "");
      break;
  }
}